

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_pool_2d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int k1,int s0,int s1,float p0,
            float p1)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  undefined4 in_EDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int32_t params [7];
  int64_t ne [4];
  ggml_tensor *result;
  int in_stack_ffffffffffffff88;
  ggml_type in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  ggml_calc_pool_output_size(in_RSI->ne[0],in_ECX,in_R9D,in_XMM0_Da);
  ggml_calc_pool_output_size(in_RSI->ne[1],in_R8D,params[2],in_XMM1_Da);
  pgVar1 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,(int64_t *)0x1512ca);
  ggml_set_op_params((ggml_tensor *)CONCAT44(in_R9D,in_R8D),(void *)CONCAT44(in_ECX,in_EDX),0x15131f
                    );
  pgVar1->op = GGML_OP_POOL_2D;
  pgVar1->src[0] = in_RSI;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_pool_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        ggml_calc_pool_output_size(a->ne[1], k1, s1, p1),
        a->ne[2],
        a->ne[3],
    };
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D;
    result->src[0] = a;

    return result;
}